

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O0

uint32_t arm_lsl(status_register_t *cpsr,uint32_t data,uint32_t shift_amount)

{
  uint in_EDX;
  uint in_ESI;
  uint *in_RDI;
  uint32_t result;
  uint local_1c;
  uint32_t local_4;
  
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] LSL shift\n");
  }
  local_4 = in_ESI;
  if (in_EDX != 0) {
    if (in_EDX < 0x20) {
      local_1c = in_ESI << ((byte)in_EDX & 0x1f);
      if (in_RDI != (uint *)0x0) {
        *in_RDI = *in_RDI & 0xdfffffff |
                  (uint)((int)(in_ESI << ((byte)in_EDX - 1 & 0x1f)) < 0) << 0x1d;
      }
    }
    else {
      local_1c = 0;
      if (in_RDI != (uint *)0x0) {
        if (in_EDX == 0x20) {
          *in_RDI = *in_RDI & 0xdfffffff | (uint)((in_ESI & 1) != 0) << 0x1d;
        }
        else {
          *in_RDI = *in_RDI & 0xdfffffff;
        }
      }
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] result: 0x%08X\n",(ulong)local_1c);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

word arm_lsl(status_register_t* cpsr, word data, word shift_amount) {
    logdebug("LSL shift")
    if (shift_amount == 0) {
        return data;
    } else {
        word result;
        if (shift_amount < 32) {
            result = data << shift_amount;
            if (cpsr) {
                cpsr->C = (data << (shift_amount - 1u)) >> 31u;
            }
        }
        else {
            result = 0;
            if (cpsr) {
                // This has to be a special case since C doesn't like it when you << by >= the width of a type
                if (shift_amount == 32) {
                    cpsr->C = data & 1u;
                } else {
                    cpsr->C = 0;
                }
            }
        }
        logdebug("result: 0x%08X", result)
        return result;
    }

}